

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  sqlite3 *psVar1;
  int iVar2;
  Db *pDVar3;
  Db *pDb;
  int i;
  sqlite3 *db;
  char *zDb_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  pDb._4_4_ = 0;
  do {
    if (psVar1->nDb <= pDb._4_4_) {
      return;
    }
    pDVar3 = psVar1->aDb + pDb._4_4_;
    if (pDVar3->pBt != (Btree *)0x0) {
      if (zDb != (char *)0x0) {
        iVar2 = sqlite3StrICmp(zDb,pDVar3->zDbSName);
        if (iVar2 != 0) goto LAB_0019238d;
      }
      sqlite3CodeVerifySchema(pParse,pDb._4_4_);
    }
LAB_0019238d:
    pDb._4_4_ = pDb._4_4_ + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}